

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O2

char * __thiscall llama_vocab::token_get_text(llama_vocab *this,llama_token id)

{
  _Head_base<0UL,_llama_vocab::impl_*,_false> _Var1;
  reference pvVar2;
  
  _Var1._M_head_impl =
       (this->pimpl)._M_t.
       super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>._M_t.
       super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>.
       super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl;
  if ((_Var1._M_head_impl)->type != LLAMA_VOCAB_TYPE_NONE) {
    pvVar2 = std::vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>::at
                       (&(_Var1._M_head_impl)->id_to_token,(long)id);
    return (pvVar2->text)._M_dataplus._M_p;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-vocab.cpp"
             ,0xb38,"GGML_ASSERT(%s) failed","pimpl->type != LLAMA_VOCAB_TYPE_NONE");
}

Assistant:

const char * llama_vocab::token_get_text(llama_token id) const {
    GGML_ASSERT(pimpl->type != LLAMA_VOCAB_TYPE_NONE);
    return pimpl->id_to_token.at(id).text.c_str();
}